

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::scanOutput(Parser *this,ScannedTopLevelItem *item)

{
  bool bVar1;
  Module *pMVar2;
  OutputDeclaration *o;
  string *name;
  Identifier *args;
  CodeLocation *args_00;
  pool_ref<soul::heart::OutputDeclaration> local_90;
  CompileMessage local_88;
  undefined1 local_40 [8];
  CodeLocation errorLocation;
  OutputDeclaration *outputDeclaration;
  Ptr local_18;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  local_18.object = (SourceCodeText *)item;
  item_local = (ScannedTopLevelItem *)this;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)&outputDeclaration);
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::push_back
            (&item->outputDecls,(value_type *)&outputDeclaration);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  args_00 = &(this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location;
  o = Module::allocate<soul::heart::OutputDeclaration,soul::CodeLocation&>(pMVar2,args_00);
  errorLocation.location.data = (char *)parseGeneralIdentifier(this);
  (o->super_IODeclaration).name.name = (string *)errorLocation.location.data;
  CodeLocation::CodeLocation((CodeLocation *)local_40,args_00);
  name = Identifier::operator_cast_to_string_(&(o->super_IODeclaration).name);
  bVar1 = isReservedFunctionName(name);
  if (!bVar1) {
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    pool_ref<soul::heart::OutputDeclaration>::pool_ref<soul::heart::OutputDeclaration,void>
              (&local_90,o);
    std::
    vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
    ::push_back(&pMVar2->outputs,&local_90);
    pool_ref<soul::heart::OutputDeclaration>::~pool_ref(&local_90);
    skipPastNextOccurrenceOf(this,(TokenType)0x54c9e0);
    CodeLocation::~CodeLocation((CodeLocation *)local_40);
    return;
  }
  Errors::invalidEndpointName<soul::Identifier&>
            (&local_88,(Errors *)&(o->super_IODeclaration).name,args);
  CodeLocation::throwError((CodeLocation *)local_40,&local_88);
}

Assistant:

void scanOutput (ScannedTopLevelItem& item)
    {
        item.outputDecls.push_back (getCurrentTokeniserPosition());
        auto& outputDeclaration = module->allocate<heart::OutputDeclaration> (location);
        outputDeclaration.name = parseGeneralIdentifier();

        auto errorLocation = location;
        if (isReservedFunctionName (outputDeclaration.name))
            errorLocation.throwError (Errors::invalidEndpointName (outputDeclaration.name));

        module->outputs.push_back (outputDeclaration);
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }